

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

Id __thiscall
dxil_spv::Converter::Impl::fixup_store_type_typed
          (Impl *this,ComponentType component_type,uint components,Id value)

{
  ComponentType input_type;
  Id IVar1;
  Builder *pBVar2;
  Builder *this_00;
  Operation *this_01;
  Operation *this_02;
  undefined7 in_register_00000031;
  undefined8 uVar3;
  ulong uVar4;
  Id u64_ids [4];
  Id local_48 [6];
  
  uVar3 = CONCAT71(in_register_00000031,component_type);
  input_type = U16;
  switch((int)uVar3) {
  case 2:
    uVar3 = 4;
    break;
  case 3:
    uVar3 = 5;
    break;
  case 4:
    input_type = U32;
    break;
  default:
    return value;
  case 6:
    input_type = U64;
    break;
  case 7:
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    if (1 < components) {
      uVar4 = 0;
      do {
        pBVar2 = SPIRVModule::get_builder(this->spirv_module);
        this_00 = SPIRVModule::get_builder(this->spirv_module);
        IVar1 = spv::Builder::makeIntegerType(this_00,0x20,false);
        IVar1 = spv::Builder::makeVectorType(pBVar2,IVar1,2);
        this_01 = allocate(this,OpVectorShuffle,IVar1);
        Operation::add_id(this_01,value);
        Operation::add_id(this_01,value);
        Operation::add_literal(this_01,(uint32_t)uVar4);
        Operation::add_literal(this_01,(uint32_t)uVar4 + 1);
        add(this,this_01,false);
        pBVar2 = SPIRVModule::get_builder(this->spirv_module);
        IVar1 = spv::Builder::makeIntegerType(pBVar2,0x40,false);
        this_02 = allocate(this,OpBitcast,IVar1);
        Operation::add_id(this_02,this_01->id);
        add(this,this_02,false);
        *(Id *)((long)local_48 + uVar4 * 2) = this_02->id;
        uVar4 = uVar4 + 2;
      } while ((components & 0xfffffffe) != uVar4);
    }
    if (components != 0) {
      uVar4 = (ulong)(components >> 1);
      do {
        pBVar2 = SPIRVModule::get_builder(this->spirv_module);
        IVar1 = spv::Builder::makeIntegerType(pBVar2,0x40,false);
        IVar1 = spv::Builder::makeInt64Constant(pBVar2,IVar1,0,false);
        local_48[uVar4] = IVar1;
        uVar4 = uVar4 + 1;
      } while (uVar4 < components);
    }
    pBVar2 = SPIRVModule::get_builder(this->spirv_module);
    IVar1 = spv::Builder::makeIntegerType(pBVar2,0x40,false);
    IVar1 = build_vector(this,IVar1,local_48,components);
    return IVar1;
  case 8:
    uVar3 = 9;
    input_type = F16;
    if (((this->execution_mode_meta).native_16bit_operations == false) &&
       (((this->options).min_precision_prefer_native_16bit & 1U) == 0)) {
      return value;
    }
  }
  IVar1 = build_value_cast(this,value,input_type,(ComponentType)uVar3,components);
  return IVar1;
}

Assistant:

spv::Id Converter::Impl::fixup_store_type_typed(DXIL::ComponentType component_type, unsigned components, spv::Id value)
{
	if (component_type == DXIL::ComponentType::U64)
	{
		// If the component type is U64 it's used for atomics, but load/store interface is still 32-bit.
		// Bit-cast rather than value cast.
		spv::Id u64_ids[4] = {};
		for (unsigned i = 0; i < components / 2; i++)
		{
			auto *shuffle_op = allocate(spv::OpVectorShuffle, builder().makeVectorType(builder().makeUintType(32), 2));
			shuffle_op->add_id(value);
			shuffle_op->add_id(value);
			shuffle_op->add_literal(2 * i + 0);
			shuffle_op->add_literal(2 * i + 1);
			add(shuffle_op);

			auto *cast_op = allocate(spv::OpBitcast, builder().makeUintType(64));
			cast_op->add_id(shuffle_op->id);
			add(cast_op);
			u64_ids[i] = cast_op->id;
		}

		for (unsigned i = components / 2; i < components; i++)
			u64_ids[i] = builder().makeUint64Constant(0);

		value = build_vector(builder().makeUintType(64), u64_ids, components);
	}
	else
	{
		auto output_component_type = get_effective_typed_resource_type(component_type);
		auto input_component_type = component_type;

		if (input_component_type == DXIL::ComponentType::F16 && !support_native_fp16_operations())
			input_component_type = convert_16bit_component_to_32bit(input_component_type);
		input_component_type = convert_component_to_unsigned(input_component_type);

		if (output_component_type != input_component_type)
			value = build_value_cast(value, input_component_type, output_component_type, components);
	}

	return value;
}